

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_handle_invalid_connection
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code,char *reason)

{
  int iVar1;
  int in_EDX;
  nghttp2_frame *in_RSI;
  nghttp2_session *in_RDI;
  uint32_t in_stack_ffffffffffffffcc;
  int local_4;
  
  if (((in_RDI->callbacks).on_invalid_frame_recv_callback ==
       (nghttp2_on_invalid_frame_recv_callback)0x0) ||
     (iVar1 = (*(in_RDI->callbacks).on_invalid_frame_recv_callback)
                        (in_RDI,in_RSI,in_EDX,in_RDI->user_data), iVar1 == 0)) {
    get_error_code_from_lib_error_code(in_EDX);
    local_4 = nghttp2_session_terminate_session_with_reason
                        (in_RDI,in_stack_ffffffffffffffcc,(char *)0x1121a3);
  }
  else {
    local_4 = -0x386;
  }
  return local_4;
}

Assistant:

static int session_handle_invalid_connection(nghttp2_session *session,
                                             nghttp2_frame *frame,
                                             int lib_error_code,
                                             const char *reason) {
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
          session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return nghttp2_session_terminate_session_with_reason(
    session, get_error_code_from_lib_error_code(lib_error_code), reason);
}